

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  code *pcVar1;
  string_view format_str;
  string_view format_str_00;
  int iVar2;
  CpuRegisters *pCVar3;
  IMos6502 *pIVar4;
  undefined4 extraout_var;
  Nes *nes_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _anonymous_namespace_ *this;
  bool bVar5;
  exception *e;
  undefined1 local_500 [8];
  string execution_string;
  CpuState state;
  int local_49c;
  undefined1 local_498 [4];
  int i;
  CpuState prev_state;
  ifstream fs;
  undefined1 local_258 [8];
  Nes nes;
  char **argv_local;
  int argc_local;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_1e0;
  char *local_1d8;
  size_t local_1d0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_1c8 [2];
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_1b8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *vargs;
  char *local_1a8;
  size_t sStack_1a0;
  format_args local_198;
  char *local_188;
  size_t local_180;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_178 [2];
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_168;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_158;
  size_t sStack_150;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_const_char_*> *vargs_2;
  char **local_f0;
  char *local_e8;
  size_t sStack_e0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_d0;
  int *local_c8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_c0;
  undefined8 local_b8;
  int *local_b0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_a8;
  char **local_a0;
  char *local_98;
  size_t sStack_90;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_80;
  format_args *local_78;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_70;
  undefined8 local_68;
  format_args *local_60;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_58;
  
  argv_local._4_4_ = 0;
  if (argc == 2) {
    n_e_s::nes::Nes::Nes((Nes *)local_258);
    std::ifstream::ifstream(&prev_state.cycle,argv[1],_S_bin);
    n_e_s::nes::Nes::load_rom((Nes *)local_258,(istream *)&prev_state.cycle);
    pCVar3 = n_e_s::nes::Nes::cpu_registers((Nes *)local_258);
    pCVar3->pc = 0xc000;
    std::optional<n_e_s::core::Opcode>::optional((optional<n_e_s::core::Opcode> *)local_498);
    prev_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
    super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.address_mode._0_2_ = 0;
    prev_state.start_pc = 0;
    prev_state._18_6_ = 0;
    prev_state.start_cycle = 0;
    local_49c = 0;
    while (local_49c < 1000000) {
      n_e_s::nes::Nes::execute((Nes *)local_258);
      n_e_s::nes::Nes::execute((Nes *)local_258);
      n_e_s::nes::Nes::execute((Nes *)local_258);
      n_e_s::nes::Nes::execute((Nes *)local_258);
      pIVar4 = n_e_s::nes::Nes::cpu((Nes *)local_258);
      iVar2 = (*(pIVar4->super_ICpu)._vptr_ICpu[4])();
      memcpy((void *)((long)&execution_string.field_2 + 8),(void *)CONCAT44(extraout_var,iVar2),0x28
            );
      if ((local_49c == 0) || (prev_state._16_8_ != state._16_8_)) {
        this = (_anonymous_namespace_ *)local_258;
        (anonymous_namespace)::get_execution_string_abi_cxx11_((string *)local_500,this,nes_00);
        local_158 = "{}\n";
        sStack_150 = 3;
        vargs_1 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_500;
        local_178[0] = fmt::v8::
                       make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string_const&>
                                 (vargs_1,(v8 *)this,args);
        local_168 = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_178;
        local_a0 = &local_158;
        local_188 = local_158;
        local_180 = sStack_150;
        local_78 = &local_198;
        local_68 = 0xd;
        local_198.desc_ = 0xd;
        local_198.field_1.values_ = local_168;
        format_str_00.size_ = sStack_150;
        format_str_00.data_ = local_158;
        local_98 = local_188;
        sStack_90 = local_180;
        local_80 = local_168;
        local_70 = local_168;
        local_60 = local_78;
        local_58 = local_168;
        fmt::v8::vprint(format_str_00,local_198);
        memcpy(local_498,(void *)((long)&execution_string.field_2 + 8),0x28);
        std::__cxx11::string::~string((string *)local_500);
      }
      bVar5 = SCARRY4(local_49c,1);
      local_49c = local_49c + 1;
      if (bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    std::ifstream::~ifstream(&prev_state.cycle);
    n_e_s::nes::Nes::~Nes((Nes *)local_258);
  }
  else {
    nes.cycle_ = (uint64_t)anon_var_dwarf_2b;
    local_1a8 = "Expected one argument; nestest.nes\n";
    sStack_1a0 = 0x23;
    vargs = _stderr;
    local_1c8[0] = fmt::v8::make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>>
                             ();
    local_1b8 = local_1c8;
    local_f0 = &local_1a8;
    local_1d8 = local_1a8;
    local_1d0 = sStack_1a0;
    local_c8 = &argc_local;
    local_b8 = 0;
    _argc_local = 0;
    local_1e0 = local_1b8;
    format_str.size_ = sStack_1a0;
    format_str.data_ = local_1a8;
    local_e8 = local_1d8;
    sStack_e0 = local_1d0;
    local_d0 = local_1b8;
    local_c0 = local_1b8;
    local_b0 = local_c8;
    local_a8 = local_1b8;
    fmt::v8::vprint((FILE *)vargs,format_str,_argc_local);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 2) {
        fmt::print(stderr, "Expected one argument; nestest.nes\n");
        return 1;
    }

    try {
        n_e_s::nes::Nes nes;
        std::ifstream fs(argv[1], std::ios::binary);
        nes.load_rom(fs);
        nes.cpu_registers().pc = 0xC000;

        n_e_s::core::CpuState prev_state{};

        for (int i = 0; i < 1000000; ++i) {
            nes.execute();
            nes.execute();
            nes.execute();
            nes.execute();

            const auto state = nes.cpu().state();

            if (i == 0 || prev_state.start_cycle != state.start_cycle) {
                const std::string execution_string = get_execution_string(nes);
                fmt::print("{}\n", execution_string);

                prev_state = state;
            }
        }
    } catch (const std::exception &e) {
        fmt::print(stderr, "Expcetion: {}\n", e.what());
    }
}